

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.h
# Opt level: O1

int http1_consume_header_trailer
              (http1_parser_s *parser,uint8_t *start,uint8_t *end_name,uint8_t *start_value,
              uint8_t *end)

{
  int iVar1;
  size_t name_len;
  
  name_len = (long)end_name - (long)start;
  if ((((long)name_len < 2) || (*start != 'x')) &&
     ((name_len != 0xd ||
      (*(long *)(start + 5) != 0x676e696d69742d72 || *(long *)start != 0x742d726576726573)))) {
    return 0;
  }
  iVar1 = http1_on_header(parser,(char *)start,name_len,(char *)start_value,
                          (long)end - (long)start_value);
  return -(uint)(iVar1 != 0);
}

Assistant:

inline static int http1_consume_header_trailer(http1_parser_s *parser,
                                               uint8_t *start,
                                               uint8_t *end_name,
                                               uint8_t *start_value,
                                               uint8_t *end) {
  if ((end_name - start) > 1 && start[0] == 'x') {
    /* X- headers are allowed */
    goto white_listed;
  }

  /* white listed trailer names */
  const struct {
    char *name;
    long len;
  } http1_trailer_white_list[] = {
      {"server-timing", 13}, /* specific for client data... */
      {NULL, 0},             /* end of list marker */
  };
  for (size_t i = 0; http1_trailer_white_list[i].name; ++i) {
    if ((long)(end_name - start) == http1_trailer_white_list[i].len &&
        HEADER_NAME_IS_EQ((char *)start, http1_trailer_white_list[i].name,
                          http1_trailer_white_list[i].len)) {
      /* header disallowed here */
      goto white_listed;
    }
  }
  return 0;
white_listed:
  /* perform callback */
  if (http1_on_header(parser, (char *)start, (end_name - start),
                      (char *)start_value, end - start_value))
    return -1;
  return 0;
}